

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

bool __thiscall bloaty::dwarf::AddressRanges::NextUnit(AddressRanges *this)

{
  bool bVar1;
  byte bVar2;
  uchar uVar3;
  char *pcVar4;
  const_pointer offset;
  const_pointer pvVar5;
  string_view *data;
  string_view *in_RDI;
  string_view sVar6;
  size_t aligned_ofs;
  size_t ofs;
  CompilationUnitSizes *in_stack_00000030;
  uint8_t segment_size;
  string_view *in_stack_ffffffffffffffa8;
  string_view *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int line;
  CompilationUnitSizes *in_stack_ffffffffffffffc8;
  char *local_20;
  char *local_18;
  bool local_1;
  
  line = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[3]._M_str);
  if (bVar1) {
    local_1 = false;
  }
  else {
    sVar6 = CompilationUnitSizes::ReadInitialLength(in_stack_ffffffffffffffc8,in_RDI);
    local_20 = (char *)sVar6._M_len;
    in_RDI[2]._M_str = local_20;
    local_18 = sVar6._M_str;
    in_RDI[3]._M_len = (size_t)local_18;
    CompilationUnitSizes::ReadDWARFVersion
              ((CompilationUnitSizes *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar2 = CompilationUnitSizes::dwarf_version((CompilationUnitSizes *)in_RDI);
    if (4 < bVar2) {
      Throw((char *)in_RDI,line);
    }
    pcVar4 = (char *)CompilationUnitSizes::ReadDWARFOffset
                               ((CompilationUnitSizes *)in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8);
    in_RDI[4]._M_str = pcVar4;
    ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffffb0);
    CompilationUnitSizes::SetAddressSize(in_stack_00000030,ofs._7_1_);
    uVar3 = ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffffb0);
    if (uVar3 != '\0') {
      Throw((char *)in_RDI,line);
    }
    offset = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[2]._M_str);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[1]._M_str);
    data = (string_view *)(offset + -(long)pvVar5);
    CompilationUnitSizes::address_size((CompilationUnitSizes *)in_RDI);
    AlignUp((size_t)offset,(size_t)in_stack_ffffffffffffffa8);
    SkipBytes((size_t)in_RDI,data);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AddressRanges::NextUnit() {
  if (next_unit_.empty()) {
    return false;
  }

  unit_remaining_ = sizes_.ReadInitialLength(&next_unit_);
  sizes_.ReadDWARFVersion(&unit_remaining_);

  if (sizes_.dwarf_version() > 4) {
    THROW("DWARF data is too new for us");
  }

  debug_info_offset_ = sizes_.ReadDWARFOffset(&unit_remaining_);

  uint8_t segment_size;

  sizes_.SetAddressSize(ReadFixed<uint8_t>(&unit_remaining_));
  segment_size = ReadFixed<uint8_t>(&unit_remaining_);

  if (segment_size) {
    THROW("we don't know how to handle segmented addresses.");
  }

  size_t ofs = unit_remaining_.data() - section_.data();
  size_t aligned_ofs = AlignUp(ofs, sizes_.address_size() * 2);
  SkipBytes(aligned_ofs - ofs, &unit_remaining_);
  return true;
}